

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O3

void __thiscall
supermap::io::FileOutputStream::FileOutputStream
          (FileOutputStream *this,string *filename,bool append)

{
  pointer pcVar1;
  FileException *this_00;
  _Ios_Openmode _Var2;
  undefined7 in_register_00000011;
  string local_50;
  
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR_get_0010eae8;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename_,pcVar1,pcVar1 + filename->_M_string_length);
  _Var2 = _S_out;
  if ((int)CONCAT71(in_register_00000011,append) != 0) {
    _Var2 = _S_app;
  }
  std::ofstream::ofstream(&this->ofs_,(string *)filename,_Var2);
  if (*(int *)(&this->field_0x48 + *(long *)(*(long *)&this->ofs_ + -0x18)) == 0) {
    return;
  }
  this_00 = (FileException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Unable to open for writing","");
  FileException::FileException(this_00,filename,&local_50);
  __cxa_throw(this_00,&FileException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

FileOutputStream::FileOutputStream(const std::string &filename, bool append)
    : filename_(filename), ofs_(filename, append ? std::ios_base::app : std::ios_base::out) {
    if (!ofs_.good() || ofs_.bad()) {
        throw FileException(filename, "Unable to open for writing");
    }
}